

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O2

Io_BlifObj_t ** Io_BlifHashLookup(Io_BlifMan_t *p,char *pName)

{
  char cVar1;
  Io_BlifObj_t *pIVar2;
  Io_BlifObj_t **ppIVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Io_BlifObj_t **ppIVar7;
  
  uVar5 = 0;
  uVar6 = 0;
  while( true ) {
    cVar1 = pName[uVar5];
    if (cVar1 == '\0') break;
    uVar6 = uVar6 ^ (int)cVar1 * (int)cVar1 *
                    *(int *)(Io_BlifHashString_s_Primes + ((ulong)uVar5 % 10) * 4);
    uVar5 = uVar5 + 1;
  }
  ppIVar3 = p->pTable + (ulong)uVar6 % (ulong)(uint)p->nTableSize;
  do {
    ppIVar7 = ppIVar3;
    pIVar2 = *ppIVar7;
    if (pIVar2 == (Io_BlifObj_t *)0x0) {
      return ppIVar7;
    }
    iVar4 = strcmp(pIVar2->pName,pName);
    ppIVar3 = &pIVar2->pNext;
  } while (iVar4 != 0);
  return ppIVar7;
}

Assistant:

static Io_BlifObj_t ** Io_BlifHashLookup( Io_BlifMan_t * p, char * pName )
{
    Io_BlifObj_t ** ppEntry;
    for ( ppEntry = p->pTable + Io_BlifHashString(pName, p->nTableSize); *ppEntry; ppEntry = &(*ppEntry)->pNext )
        if ( !strcmp((*ppEntry)->pName, pName) )
            return ppEntry;
    return ppEntry;
}